

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

string * __thiscall pbrt::MLTIntegrator::ToString_abi_cxx11_(MLTIntegrator *this)

{
  int *unaff_RBX;
  string *in_RDI;
  int *unaff_R14;
  int *unaff_retaddr;
  CameraHandle *in_stack_00000008;
  char *in_stack_00000010;
  int *in_stack_00000040;
  float *in_stack_00000048;
  float *in_stack_00000050;
  LightSamplerHandle *in_stack_00000058;
  bool *in_stack_00000060;
  
  StringPrintf<pbrt::CameraHandle_const&,int_const&,int_const&,int_const&,int_const&,float_const&,float_const&,pbrt::LightSamplerHandle_const&,bool_const&>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_R14,unaff_RBX,in_stack_00000040
             ,in_stack_00000048,in_stack_00000050,in_stack_00000058,in_stack_00000060);
  return in_RDI;
}

Assistant:

std::string MLTIntegrator::ToString() const {
    return StringPrintf("[ MLTIntegrator camera: %s maxDepth: %d nBootstrap: %d "
                        "nChains: %d mutationsPerPixel: %d sigma: %f "
                        "largeStepProbability: %f lightSampler: %s regularize: %s ]",
                        camera, maxDepth, nBootstrap, nChains, mutationsPerPixel, sigma,
                        largeStepProbability, lightSampler, regularize);
}